

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

size_t x86_Convert(_7zip *zip,uint8_t *data,size_t size)

{
  uint32_t uVar1;
  char cVar2;
  uint uVar3;
  int b_index;
  uint uStack_58;
  uint8_t b_1;
  uint32_t dest;
  uint32_t src;
  uchar b;
  uint8_t *limit;
  uint8_t *p;
  uint32_t prevMask;
  uint32_t ip;
  size_t prevPosT;
  size_t bufferPos;
  size_t size_local;
  uint8_t *data_local;
  _7zip *zip_local;
  
  if (size < 5) {
    zip_local = (_7zip *)0x0;
  }
  else {
    prevPosT = 0;
    p._0_4_ = zip->bcj_prevMask;
    uVar1 = zip->bcj_ip;
    _prevMask = (_7zip *)zip->bcj_prevPosT;
    while( true ) {
      for (limit = data + prevPosT; (limit < data + (size - 4) && ((*limit & 0xfe) != 0xe8));
          limit = limit + 1) {
      }
      zip_local = (_7zip *)(limit + -(long)data);
      if (data + (size - 4) <= limit) break;
      if ((ulong)((long)zip_local - (long)_prevMask) < 4) {
        uVar3 = (uint)p << ((char)((long)zip_local - (long)_prevMask) - 1U & 0x1f);
        p._0_4_ = uVar3 & 7;
        if (((uint)p == 0) ||
           ((("\x01\x01\x01"[(uint)p] != '\0' && (limit[(int)(4 - (uint)""[(uint)p])] != '\0')) &&
            (limit[(int)(4 - (uint)""[(uint)p])] != 0xff)))) goto LAB_00810d3a;
        p._0_4_ = (uVar3 & 3) << 1 | 1;
        prevPosT = (long)&(zip_local->si).pi.pos + 1;
        _prevMask = zip_local;
      }
      else {
        p._0_4_ = 0;
LAB_00810d3a:
        if ((limit[4] == '\0') || (limit[4] == 0xff)) {
          uStack_58 = (uint)limit[4] << 0x18 | (uint)limit[3] << 0x10 | (uint)limit[2] << 8 |
                      (uint)limit[1];
          while (uStack_58 = uStack_58 - (uVar1 + (int)zip_local), (uint)p != 0) {
            cVar2 = (char)(uStack_58 >> (""[(uint)p] * -8 + 0x18 & 0x1f));
            if ((cVar2 != '\0') && (cVar2 != -1)) break;
            uStack_58 = uStack_58 ^ (1 << (""[(uint)p] * -8 + 0x20 & 0x1f)) - 1U;
          }
          limit[4] = ((byte)(uStack_58 >> 0x18) & 1) - 1 ^ 0xff;
          limit[3] = (uint8_t)(uStack_58 >> 0x10);
          limit[2] = (uint8_t)(uStack_58 >> 8);
          limit[1] = (uint8_t)uStack_58;
          prevPosT = (long)&(zip_local->si).pi.pos + 5;
          _prevMask = zip_local;
        }
        else {
          p._0_4_ = ((uint)p & 3) << 1 | 1;
          prevPosT = (long)&(zip_local->si).pi.pos + 1;
          _prevMask = zip_local;
        }
      }
    }
    zip->bcj_prevPosT = (size_t)_prevMask;
    zip->bcj_prevMask = (uint)p;
    zip->bcj_ip = (int)zip_local + zip->bcj_ip;
  }
  return (size_t)zip_local;
}

Assistant:

static size_t
x86_Convert(struct _7zip *zip, uint8_t *data, size_t size)
{
	static const uint8_t kMaskToAllowedStatus[8] = {1, 1, 1, 0, 1, 0, 0, 0};
	static const uint8_t kMaskToBitNumber[8] = {0, 1, 2, 2, 3, 3, 3, 3};
	size_t bufferPos, prevPosT;
	uint32_t ip, prevMask;

	if (size < 5)
		return 0;

	bufferPos = 0;
	prevPosT = zip->bcj_prevPosT;
	prevMask = zip->bcj_prevMask;
	ip = zip->bcj_ip;

	for (;;) {
		uint8_t *p = data + bufferPos;
		uint8_t *limit = data + size - 4;

		for (; p < limit; p++)
			if ((*p & 0xFE) == 0xE8)
				break;
		bufferPos = (size_t)(p - data);
		if (p >= limit)
			break;
		prevPosT = bufferPos - prevPosT;
		if (prevPosT > 3)
			prevMask = 0;
		else {
			prevMask = (prevMask << ((int)prevPosT - 1)) & 0x7;
			if (prevMask != 0) {
				unsigned char b =
					p[4 - kMaskToBitNumber[prevMask]];
				if (!kMaskToAllowedStatus[prevMask] ||
				    Test86MSByte(b)) {
					prevPosT = bufferPos;
					prevMask = ((prevMask << 1) & 0x7) | 1;
					bufferPos++;
					continue;
				}
			}
		}
		prevPosT = bufferPos;

		if (Test86MSByte(p[4])) {
			uint32_t src = ((uint32_t)p[4] << 24) |
				((uint32_t)p[3] << 16) | ((uint32_t)p[2] << 8) |
				((uint32_t)p[1]);
			uint32_t dest;
			for (;;) {
				uint8_t b;
				int b_index;

				dest = src - (ip + (uint32_t)bufferPos);
				if (prevMask == 0)
					break;
				b_index = kMaskToBitNumber[prevMask] * 8;
				b = (uint8_t)(dest >> (24 - b_index));
				if (!Test86MSByte(b))
					break;
				src = dest ^ ((1 << (32 - b_index)) - 1);
			}
			p[4] = (uint8_t)(~(((dest >> 24) & 1) - 1));
			p[3] = (uint8_t)(dest >> 16);
			p[2] = (uint8_t)(dest >> 8);
			p[1] = (uint8_t)dest;
			bufferPos += 5;
		} else {
			prevMask = ((prevMask << 1) & 0x7) | 1;
			bufferPos++;
		}
	}
	zip->bcj_prevPosT = prevPosT;
	zip->bcj_prevMask = prevMask;
	zip->bcj_ip += (uint32_t)bufferPos;
	return (bufferPos);
}